

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

Vec_Vec_t * Saig_ManDetectConstrFunc(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  byte *pbVar8;
  Bar_Progress_t *p_02;
  Vec_Vec_t *p_03;
  uint uVar9;
  int nWords;
  int iVar10;
  ulong uVar11;
  long lVar12;
  Aig_Obj_t **ppAStack_80;
  int iPat;
  Cnf_Dat_t *local_58;
  sat_solver *local_50;
  Vec_Ptr_t *local_48;
  uint local_40;
  int Lit;
  Aig_Man_t *local_38;
  
  iPat = 0;
  if (p->nTruePos != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x2a1,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
  }
  p_00 = Saig_ManUnrollCOI(p,nFrames);
  if (p_00->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(pFrames) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x2ab,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
  }
  if (fVerbose == 0) {
    iVar3 = 1;
  }
  else {
    printf("Detecting constraints with %d frames, %d conflicts, and %d propagations.\n",
           (ulong)(uint)nFrames,(ulong)(uint)nConfs,(ulong)(uint)nProps);
    printf("Frames: ");
    Aig_ManPrintStats(p_00);
    iVar3 = p_00->nObjs[3];
  }
  p_01 = Cnf_DeriveSimple(p_00,iVar3);
  iVar10 = 0;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  piVar2 = p_01->pVarNums;
  local_58 = p_01;
  pAVar5 = Aig_ManCo(p_00,0);
  Lit = piVar2[pAVar5->Id] * 2;
  local_50 = s;
  iVar3 = sat_solver_solve(s,&Lit,(lit *)&local_38,(long)nConfs,0,0,0);
  if (iVar3 == 1) {
    pVVar6 = Vec_PtrAllocSimInfo(p_00->vObjs->nSize,0x10);
    Vec_PtrCleanSimInfo(pVVar6,0x10,nWords);
    ppAStack_80 = (Aig_Obj_t **)&iPat;
    Saig_CollectSatValues(local_50,local_58,pVVar6,(int *)ppAStack_80);
    while( true ) {
      iVar3 = p_00->vObjs->nSize;
      if (iVar3 <= iVar10) break;
      pvVar7 = Vec_PtrEntry(p_00->vObjs,iVar10);
      if ((pvVar7 != (void *)0x0) &&
         (pbVar8 = (byte *)Vec_PtrEntry(pVVar6,iVar10), (*pbVar8 & 1) != 0)) {
        pbVar8[0x30] = 0xff;
        pbVar8[0x31] = 0xff;
        pbVar8[0x32] = 0xff;
        pbVar8[0x33] = 0xff;
        pbVar8[0x34] = 0xff;
        pbVar8[0x35] = 0xff;
        pbVar8[0x36] = 0xff;
        pbVar8[0x37] = 0xff;
        pbVar8[0x38] = 0xff;
        pbVar8[0x39] = 0xff;
        pbVar8[0x3a] = 0xff;
        pbVar8[0x3b] = 0xff;
        pbVar8[0x3c] = 0xff;
        pbVar8[0x3d] = 0xff;
        pbVar8[0x3e] = 0xff;
        pbVar8[0x3f] = 0xff;
        pbVar8[0x20] = 0xff;
        pbVar8[0x21] = 0xff;
        pbVar8[0x22] = 0xff;
        pbVar8[0x23] = 0xff;
        pbVar8[0x24] = 0xff;
        pbVar8[0x25] = 0xff;
        pbVar8[0x26] = 0xff;
        pbVar8[0x27] = 0xff;
        pbVar8[0x28] = 0xff;
        pbVar8[0x29] = 0xff;
        pbVar8[0x2a] = 0xff;
        pbVar8[0x2b] = 0xff;
        pbVar8[0x2c] = 0xff;
        pbVar8[0x2d] = 0xff;
        pbVar8[0x2e] = 0xff;
        pbVar8[0x2f] = 0xff;
        pbVar8[0x10] = 0xff;
        pbVar8[0x11] = 0xff;
        pbVar8[0x12] = 0xff;
        pbVar8[0x13] = 0xff;
        pbVar8[0x14] = 0xff;
        pbVar8[0x15] = 0xff;
        pbVar8[0x16] = 0xff;
        pbVar8[0x17] = 0xff;
        pbVar8[0x18] = 0xff;
        pbVar8[0x19] = 0xff;
        pbVar8[0x1a] = 0xff;
        pbVar8[0x1b] = 0xff;
        pbVar8[0x1c] = 0xff;
        pbVar8[0x1d] = 0xff;
        pbVar8[0x1e] = 0xff;
        pbVar8[0x1f] = 0xff;
        pbVar8[0] = 0xff;
        pbVar8[1] = 0xff;
        pbVar8[2] = 0xff;
        pbVar8[3] = 0xff;
        pbVar8[4] = 0xff;
        pbVar8[5] = 0xff;
        pbVar8[6] = 0xff;
        pbVar8[7] = 0xff;
        pbVar8[8] = 0xff;
        pbVar8[9] = 0xff;
        pbVar8[10] = 0xff;
        pbVar8[0xb] = 0xff;
        pbVar8[0xc] = 0xff;
        pbVar8[0xd] = 0xff;
        pbVar8[0xe] = 0xff;
        pbVar8[0xf] = 0xff;
      }
      iVar10 = iVar10 + 1;
    }
    local_48 = pVVar6;
    p_02 = Bar_ProgressStart(_stdout,iVar3);
    Aig_ManCleanMarkAB(p_00);
    iVar3 = 0;
    uVar11 = 0;
    while( true ) {
      if (p_00->vObjs->nSize <= iVar3) break;
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00->vObjs,iVar3);
      if ((pAVar5 != (Aig_Obj_t *)0x0) &&
         ((uVar4 = *(uint *)&pAVar5->field_0x18 & 7, uVar4 == 2 || (uVar4 - 5 < 2)))) {
        if ((p_02 == (Bar_Progress_t *)0x0) || (p_02->nItemsNext <= iVar3)) {
          Bar_ProgressUpdate_int(p_02,iVar3,(char *)0x0);
        }
        pvVar7 = Vec_PtrEntry(local_48,iVar3);
        lVar12 = 0;
        do {
          if (lVar12 == 0x10) {
            iVar10 = Saig_DetectTryPolarity
                               (local_50,nConfs,nProps,local_58,pAVar5,0,local_48,&iPat,fVerbose);
            ppAStack_80 = (Aig_Obj_t **)0x10;
            goto LAB_0053911a;
          }
          lVar1 = lVar12 * 4;
          lVar12 = lVar12 + 1;
        } while (*(int *)((long)pvVar7 + lVar1) == -1);
        ppAStack_80 = (Aig_Obj_t **)0x0;
LAB_0053909b:
        if (ppAStack_80 != (Aig_Obj_t **)0x10) goto code_r0x005390a1;
        iVar10 = Saig_DetectTryPolarity
                           (local_50,nConfs,nProps,local_58,pAVar5,1,local_48,&iPat,fVerbose);
        ppAStack_80 = (Aig_Obj_t **)0x20;
LAB_0053911a:
        if (iVar10 != 0) {
          *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 | (ulong)ppAStack_80;
          uVar11 = (ulong)((int)uVar11 + 1);
        }
      }
LAB_00539125:
      iVar3 = iVar3 + 1;
    }
    Bar_ProgressStop(p_02);
    if ((int)uVar11 == 0) {
      p_03 = (Vec_Vec_t *)0x0;
    }
    else {
      local_38 = p_00;
      if (fVerbose != 0) {
        printf("Found %3d classes of candidates.\n",uVar11);
      }
      p_03 = Vec_VecAlloc(nFrames);
      uVar4 = 0;
      local_40 = 0;
      if (0 < nFrames) {
        local_40 = nFrames;
      }
      for (; iVar3 = (int)ppAStack_80, uVar4 != local_40; uVar4 = uVar4 + 1) {
        lVar12 = 0;
LAB_0053918e:
        if (lVar12 < p->vObjs->nSize) {
          pvVar7 = Vec_PtrEntry(p->vObjs,(int)lVar12);
          if ((pvVar7 != (void *)0x0) &&
             ((uVar9 = *(uint *)((long)pvVar7 + 0x18) & 7, uVar9 == 2 ||
              (uVar9 = uVar9 - 5, ppAStack_80 = (Aig_Obj_t **)(ulong)uVar9, uVar9 < 2)))) {
            ppAStack_80 = p->pObjCopies;
            pAVar5 = ppAStack_80[(int)(((int)lVar12 + 1) * nFrames + ~uVar4)];
            if (pAVar5 == (Aig_Obj_t *)0x0) goto LAB_00539274;
            ppAStack_80 = *(Aig_Obj_t ***)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
            if (((ulong)ppAStack_80 & 0x10) == 0) {
              if (((ulong)ppAStack_80 & 0x20) == 0) goto LAB_00539274;
              pvVar7 = (void *)((ulong)((uint)pAVar5 & 1) ^ (ulong)pvVar7);
              for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
                pVVar6 = Vec_VecEntry(p_03,uVar9);
                iVar3 = Vec_PtrFind(pVVar6,pvVar7);
                if (-1 < iVar3) goto LAB_0053925d;
              }
            }
            else {
              pvVar7 = (void *)((ulong)((uint)pAVar5 & 1) ^ (ulong)pvVar7 ^ 1);
              for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
                pVVar6 = Vec_VecEntry(p_03,uVar9);
                iVar3 = Vec_PtrFind(pVVar6,pvVar7);
                if (-1 < iVar3) goto LAB_0053925d;
              }
            }
            goto LAB_00539266;
          }
          goto LAB_00539274;
        }
      }
      if (fVerbose != 0) {
        uVar4 = Vec_VecSizeSize(p_03);
        printf("Found %3d candidates.\n",(ulong)uVar4);
        uVar4 = p_03->nSize;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        for (uVar9 = 0; iVar3 = (int)ppAStack_80, uVar4 != uVar9; uVar9 = uVar9 + 1) {
          pVVar6 = Vec_VecEntry(p_03,uVar9);
          printf("Level %d. Cands  =%d    ",(ulong)uVar9,(ulong)(uint)pVVar6->nSize);
          putchar(10);
        }
      }
      if (p->pObjCopies != (Aig_Obj_t **)0x0) {
        free(p->pObjCopies);
        p->pObjCopies = (Aig_Obj_t **)0x0;
      }
      Saig_ManFilterUsingInd(p,p_03,nConfs,iVar3,fVerbose);
      iVar3 = Vec_VecSizeSize(p_03);
      if (iVar3 != 0) {
        uVar4 = Vec_VecSizeSize(p_03);
        printf("Found %3d constraints after filtering.\n",(ulong)uVar4);
      }
      p_00 = local_38;
      if (fVerbose != 0) {
        uVar4 = p_03->nSize;
        if (p_03->nSize < 1) {
          uVar4 = 0;
        }
        for (uVar9 = 0; p_00 = local_38, uVar4 != uVar9; uVar9 = uVar9 + 1) {
          pVVar6 = Vec_VecEntry(p_03,uVar9);
          printf("Level %d. Constr =%d    ",(ulong)uVar9,(ulong)(uint)pVVar6->nSize);
          putchar(10);
        }
      }
    }
    Vec_PtrFree(local_48);
    Cnf_DataFree(local_58);
    sat_solver_delete(local_50);
    Aig_ManCleanMarkAB(p_00);
  }
  else {
    if (iVar3 == 0) {
      puts("Solver could not solve the original problem.");
      Cnf_DataFree(local_58);
      sat_solver_delete(local_50);
      Aig_ManStop(p_00);
      return (Vec_Vec_t *)0x0;
    }
    if (iVar3 != -1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                    ,0x2cc,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
    }
    p_03 = (Vec_Vec_t *)0x0;
    printf("The problem is trivially UNSAT (inductive with k=%d).\n",(ulong)(nFrames - 1));
    Cnf_DataFree(local_58);
    sat_solver_delete(local_50);
  }
  Aig_ManStop(p_00);
  return p_03;
LAB_0053925d:
  if (uVar4 == uVar9) {
LAB_00539266:
    Vec_VecPush(p_03,uVar4,pvVar7);
  }
LAB_00539274:
  lVar12 = lVar12 + 1;
  goto LAB_0053918e;
code_r0x005390a1:
  lVar12 = (long)ppAStack_80 * 4;
  ppAStack_80 = (Aig_Obj_t **)((long)ppAStack_80 + 1);
  if (*(int *)((long)pvVar7 + lVar12) != 0) goto LAB_00539125;
  goto LAB_0053909b;
}

Assistant:

Vec_Vec_t * Saig_ManDetectConstrFunc( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
    int iPat = 0, nWordsAlloc = 16;
    Bar_Progress_t * pProgress = NULL;
    Vec_Vec_t * vCands = NULL;
    Vec_Ptr_t * vInfo, * vNodes;
    Aig_Obj_t * pObj, * pRepr, * pObjNew;
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    unsigned * pInfo;
    int i, j, k, Lit, status, nCands = 0;
    assert( Saig_ManPoNum(p) == 1 );
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "The number of outputs is different from 1.\n" );
        return NULL;
    }
//printf( "Implications = %d.\n", Ssw_ManCountImplications(p, nFrames) );

    // perform unrolling
    pFrames = Saig_ManUnrollCOI( p, nFrames );
    assert( Aig_ManCoNum(pFrames) == 1 );
    if ( fVerbose )
    {
        printf( "Detecting constraints with %d frames, %d conflicts, and %d propagations.\n", nFrames, nConfs, nProps );
        printf( "Frames: " );
        Aig_ManPrintStats( pFrames );
    }
//    Aig_ManShow( pFrames, 0, NULL );

    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
//printf( "Implications = %d.\n", pSat->qhead );

    // solve the original problem
    Lit = toLitCond( pCnf->pVarNums[Aig_ObjId(Aig_ManCo(pFrames,0))], 0 );
    status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfs, 0, 0, 0 );
    if ( status == l_False )
    {
        printf( "The problem is trivially UNSAT (inductive with k=%d).\n", nFrames-1 );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Aig_ManStop( pFrames );
        return NULL;
    }
    if ( status == l_Undef )
    {
        printf( "Solver could not solve the original problem.\n" );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Aig_ManStop( pFrames );
        return NULL;
    }
    assert( status == l_True );

    // create simulation info
    vInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pFrames), nWordsAlloc );
    Vec_PtrCleanSimInfo( vInfo, 0, nWordsAlloc );
    Saig_CollectSatValues( pSat, pCnf, vInfo, &iPat );
    Aig_ManForEachObj( pFrames, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        if ( pInfo[0] & 1 )
            memset( (char*)pInfo, 0xff, 4*nWordsAlloc );
    }
//    Aig_ManShow( pFrames, 0, NULL );
//    Aig_ManShow( p, 0, NULL );

    // consider the nodes for ci=>!Out and label when it holds
    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(pFrames) );
    Aig_ManCleanMarkAB( pFrames );
    Aig_ManForEachObj( pFrames, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        Bar_ProgressUpdate( pProgress, i, NULL );
        // check if the node is available in both polarities
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        for ( k = 0; k < nWordsAlloc; k++ )
            if ( pInfo[k] != ~0 )
                break;
        if ( k == nWordsAlloc )
        {
            if ( Saig_DetectTryPolarity(pSat, nConfs, nProps, pCnf, pObj, 0, vInfo, &iPat, fVerbose) ) // !pObj is a constr
            {
                pObj->fMarkA = 1, nCands++;
//                printf( "!%d  ", Aig_ObjId(pObj) );
            }
            continue;
        }
        for ( k = 0; k < nWordsAlloc; k++ )
            if ( pInfo[k] != 0 )
                break;
        if ( k == nWordsAlloc )
        {
            if ( Saig_DetectTryPolarity(pSat, nConfs, nProps, pCnf, pObj, 1, vInfo, &iPat, fVerbose) ) //  pObj is a constr
            {
                pObj->fMarkB = 1, nCands++;
//                printf( "%d  ", Aig_ObjId(pObj) );
            }
            continue;
        }
    }
    Bar_ProgressStop( pProgress );
    if ( nCands )
    {

//        printf( "\n" );
        if ( fVerbose )
            printf( "Found %3d classes of candidates.\n", nCands );
        vCands = Vec_VecAlloc( nFrames );
        for ( k = 0; k < nFrames; k++ )
        {
            Aig_ManForEachObj( p, pObj, i )
            {
                if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                    continue;
                pRepr = p->pObjCopies[nFrames*i + nFrames-1-k];
//                pRepr = p->pObjCopies[nFrames*i + k];
                if ( pRepr == NULL )
                    continue;
                if ( Aig_Regular(pRepr)->fMarkA ) // !pObj is a constr
                {
                    pObjNew = Aig_NotCond(pObj, !Aig_IsComplement(pRepr));

                    for ( j = 0; j < k; j++ )
                        if ( Vec_PtrFind( Vec_VecEntry(vCands, j), pObjNew ) >= 0 )
                            break;
                    if ( j == k )
                        Vec_VecPush( vCands, k, pObjNew );
//                    printf( "%d->!%d ", Aig_ObjId(Aig_Regular(pRepr)), Aig_ObjId(pObj) );
                }
                else if ( Aig_Regular(pRepr)->fMarkB ) //  pObj is a constr
                {
                    pObjNew = Aig_NotCond(pObj,  Aig_IsComplement(pRepr));

                    for ( j = 0; j < k; j++ )
                        if ( Vec_PtrFind( Vec_VecEntry(vCands, j), pObjNew ) >= 0  )
                            break;
                    if ( j == k )
                        Vec_VecPush( vCands, k, pObjNew );
//                    printf( "%d->%d ", Aig_ObjId(Aig_Regular(pRepr)), Aig_ObjId(pObj) );
                }
            }
        }

//        printf( "\n" );
        if ( fVerbose )
        {
            printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
            Vec_VecForEachLevel( vCands, vNodes, k )
            {
                printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
//                Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                    printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( "\n" );
            }
        }

        ABC_FREE( p->pObjCopies );
        Saig_ManFilterUsingInd( p, vCands, nConfs, nProps, fVerbose );
        if ( Vec_VecSizeSize(vCands) )
            printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
        if ( fVerbose )
        {
            Vec_VecForEachLevel( vCands, vNodes, k )
            {
                printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
//                Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                    printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( "\n" );
            }
        }
    }
    Vec_PtrFree( vInfo );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Aig_ManCleanMarkAB( pFrames );
    Aig_ManStop( pFrames );
    return vCands;
}